

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O1

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::at(HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
     *this,size_t index,size_t count,
    vector<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    *dest)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  int32_t iVar3;
  int32_t iVar4;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *__args;
  
  ppVar2 = (dest->
           super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((dest->
      super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (dest->
    super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  __args = _nodeAt(this,index);
  if (count != 0) {
    do {
      if (__args == (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                     *)0x0) {
        _throw_exceeds_size(this->_count);
      }
      __position._M_current =
           (dest->
           super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (dest->
          super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<unsigned_long,duckdb::interval_t>,std::allocator<std::pair<unsigned_long,duckdb::interval_t>>>
        ::_M_realloc_insert<std::pair<unsigned_long,duckdb::interval_t>const&>
                  ((vector<std::pair<unsigned_long,duckdb::interval_t>,std::allocator<std::pair<unsigned_long,duckdb::interval_t>>>
                    *)dest,__position,&__args->_value);
      }
      else {
        ((__position._M_current)->second).micros = (__args->_value).second.micros;
        iVar3 = (__args->_value).second.months;
        iVar4 = (__args->_value).second.days;
        (__position._M_current)->first = (__args->_value).first;
        ((__position._M_current)->second).months = iVar3;
        ((__position._M_current)->second).days = iVar4;
        pppVar1 = &(dest->
                   super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      __args = ((__args->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->pNode;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::at(size_t index, size_t count,
                               std::vector<T> &dest) const {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#endif
    dest.clear();
    const Node<T, _Compare> *pNode = _nodeAt(index);
    // _nodeAt will (should) throw an IndexError so this
    // assert should always be true
    assert(pNode);
    while (count) {
        if (! pNode) {
            _throw_exceeds_size(_count);
        }
        dest.push_back(pNode->value());
        pNode = pNode->next();
        --count;
    }
}